

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

kp_error_t list_dir(kp_ctx *ctx,char *root,char *indent,_Bool print_path)

{
  int iVar1;
  char **__ptr;
  kp_error_t kVar2;
  kp_error_t extraout_EAX;
  size_t sVar3;
  size_t sVar4;
  size_t __nmemb;
  int nsafes;
  int local_3c;
  char **local_38;
  
  local_3c = 0;
  local_38 = (char **)calloc(0,8);
  kVar2 = list_dir_r(&local_38,&local_3c,root);
  __ptr = local_38;
  iVar1 = local_3c;
  __nmemb = (size_t)local_3c;
  if (kVar2 == 0) {
    qsort(local_38,__nmemb,8,path_sort);
    if (print_path) {
      sVar3 = strlen(ctx->ws_path);
      __printf_chk(1,"%s/\n",root + sVar3 + 1);
    }
    sVar3 = strlen(root);
    if (iVar1 < 1) goto LAB_0010625e;
    sVar4 = 0;
    do {
      __printf_chk(1,"%s%s\n",indent,__ptr[sVar4] + sVar3 + 1);
      sVar4 = sVar4 + 1;
    } while (__nmemb != sVar4);
  }
  if (0 < iVar1) {
    sVar3 = 0;
    do {
      free(__ptr[sVar3]);
      sVar3 = sVar3 + 1;
    } while (__nmemb != sVar3);
  }
LAB_0010625e:
  free(__ptr);
  return extraout_EAX;
}

Assistant:

static kp_error_t
list_dir(struct kp_ctx *ctx, char *root, char *indent, bool print_path)
{
	kp_error_t ret;
	char **safes = NULL;
	int nsafes = 0, i = 0;
	size_t ignore;

	safes = calloc(nsafes, sizeof(char *));

	if ((ret = list_dir_r(&safes, &nsafes, root)) != KP_SUCCESS) {
		goto out;
	}

	qsort(safes, nsafes, sizeof(char *), path_sort);

	if (print_path) {
		printf("%s/\n", root + strlen(ctx->ws_path) + 1);
	}
	ignore = strlen(root) + 1;
	for (i = 0; i < nsafes; i++) {
		printf("%s%s\n", indent, safes[i] + ignore);
	}

out:
	for (i = 0; i < nsafes; i++) {
		free(safes[i]);
	}
	free(safes);

	return ret;
}